

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cKHRDebugTests.cpp
# Opt level: O1

void __thiscall gl4cts::KHRDebug::TestBase::initDebug(TestBase *this)

{
  Platform *platform;
  deUint32 bits;
  uint uVar1;
  RenderContext *pRVar2;
  RenderConfig renderCfg;
  RenderConfig local_50;
  
  platform = this->m_test_base_context->m_testCtx->m_platform;
  uVar1 = (*this->m_test_base_context->m_renderCtx->_vptr_RenderContext[2])();
  local_50.type.super_ApiType.m_bits = (ApiType)(uVar1 & 0x3ff | 0x800);
  local_50.width = -1;
  local_50.height = -1;
  local_50.surfaceType = SURFACETYPE_DONT_CARE;
  local_50.windowVisibility = VISIBILITY_VISIBLE;
  local_50.id = -1;
  local_50.redBits = -1;
  local_50.greenBits = -1;
  local_50.blueBits = -1;
  local_50.alphaBits = -1;
  local_50.depthBits = -1;
  local_50.stencilBits = -1;
  local_50.numSamples = -1;
  local_50.resetNotificationStrategy = RESET_NOTIFICATION_STRATEGY_NOT_SPECIFIED;
  glu::parseRenderConfig(&local_50,this->m_test_base_context->m_testCtx->m_cmdLine);
  pRVar2 = glu::createRenderContext
                     (platform,this->m_test_base_context->m_testCtx->m_cmdLine,&local_50);
  this->m_rc = pRVar2;
  return;
}

Assistant:

void TestBase::initDebug()
{
	tcu::Platform&	platform = m_test_base_context.getTestContext().getPlatform();
	glu::RenderConfig renderCfg(
		glu::ContextType(m_test_base_context.getRenderContext().getType().getAPI(), glu::CONTEXT_DEBUG));

	parseRenderConfig(&renderCfg, m_test_base_context.getTestContext().getCommandLine());

	m_rc = createRenderContext(platform, m_test_base_context.getTestContext().getCommandLine(), renderCfg);
}